

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanNMTOKEN(QXmlStreamReaderPrivate *this)

{
  Category CVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  ushort uc;
  uint uVar5;
  long lVar6;
  long lVar7;
  QStringView s;
  
  lVar4 = 0;
  do {
    lVar2 = (this->putStack).tos;
    if (lVar2 == -1) {
      lVar2 = this->readBufferPos;
      if (lVar2 < (this->readBuffer).d.size) {
        this->readBufferPos = lVar2 + 1;
        uVar5 = (uint)(ushort)(this->readBuffer).d.ptr[lVar2];
      }
      else {
        uVar5 = getChar_helper(this);
      }
    }
    else {
      uVar5 = 0xffffffff;
      if (this->atEnd == false) {
        uVar5 = (this->putStack).data[lVar2];
        (this->putStack).tos = lVar2 + -1;
      }
    }
    if (uVar5 == 0xffffffff) {
      lVar2 = (this->textBuffer).d.size;
      lVar7 = lVar2 - lVar4;
      s.m_data = (this->textBuffer).d.ptr;
      s.m_size = lVar2;
      putString(this,s,lVar7);
      QString::resize(&this->textBuffer,lVar7);
      return lVar4;
    }
    if ((ushort)(char16_t)uVar5 < 0x80) {
      if ("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [uVar5 & 0x7f] == '\x02') goto LAB_003a716a;
    }
    else {
      CVar1 = QChar::category(uVar5 & 0xffff);
      if ((Letter_Other < CVar1) ||
         ((0x7c03fU >> (CVar1 & (Symbol_Modifier|Number_DecimalDigit)) & 1) == 0)) {
LAB_003a716a:
        lVar2 = (this->putStack).tos;
        lVar7 = (this->putStack).cap;
        if (lVar7 <= lVar2 + 1) {
          lVar2 = lVar2 + 2;
          lVar6 = lVar7 * 2;
          if (lVar2 != lVar6 && SBORROW8(lVar2,lVar6) == lVar2 + lVar7 * -2 < 0) {
            lVar6 = lVar2;
          }
          (this->putStack).cap = lVar6;
          puVar3 = (uint *)realloc((this->putStack).data,lVar6 << 2);
          (this->putStack).data = puVar3;
          if (puVar3 == (uint *)0x0) {
            qBadAlloc();
          }
        }
        lVar2 = (this->putStack).tos;
        (this->putStack).tos = lVar2 + 1;
        (this->putStack).data[lVar2 + 1] = uVar5;
        return lVar4;
      }
    }
    lVar4 = lVar4 + 1;
    QString::append(&this->textBuffer,(QChar)(char16_t)uVar5);
  } while( true );
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanNMTOKEN()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        if (fastDetermineNameChar(QChar(c)) == NotName) {
            putChar(c);
            return n;
        } else {
            ++n;
            textBuffer += QChar(c);
        }
    }

    qsizetype pos = textBuffer.size() - n;
    putString(textBuffer, pos);
    textBuffer.resize(pos);

    return n;
}